

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  ulong uVar1;
  uchar uVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  ulong __size;
  ulong uVar7;
  uchar *data;
  
  if ((info->palettesize & 0x3fffffffffffffff) == 0) {
    data = (uchar *)0x0;
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    uVar5 = 0;
    data = (uchar *)0x0;
    do {
      if ((~(uint)lVar6 & 3) != 0) {
        uVar2 = info->palette[lVar6];
        uVar1 = uVar5 + 1;
        puVar4 = data;
        __size = uVar7;
        if (uVar7 < uVar1) {
          __size = uVar1 * 3 >> 1;
          if (uVar7 * 2 < uVar1) {
            __size = uVar1;
          }
          puVar4 = (uchar *)realloc(data,__size);
          if (puVar4 == (uchar *)0x0) goto LAB_00127847;
        }
        puVar4[uVar5] = uVar2;
        uVar5 = uVar1;
        uVar7 = __size;
        data = puVar4;
      }
LAB_00127847:
      lVar6 = lVar6 + 1;
    } while (lVar6 != info->palettesize << 2);
  }
  uVar3 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar5,"PLTE",data);
  if (uVar3 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector PLTE;
  ucvector_init(&PLTE);
  for(i = 0; i != info->palettesize * 4; ++i)
  {
    /*add all channels except alpha channel*/
    if(i % 4 != 3) ucvector_push_back(&PLTE, info->palette[i]);
  }
  error = addChunk(out, "PLTE", PLTE.data, PLTE.size);
  ucvector_cleanup(&PLTE);

  return error;
}